

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blind_item_strategy.cpp
# Opt level: O3

void __thiscall
BlindItemStrategy::generateActions(BlindItemStrategy *this,PlayerSight *sight,Actions *actions)

{
  int iVar1;
  Randomizer *this_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec2 pos;
  
  if (this->field_0xc != '\0') {
    return;
  }
  iVar4 = sight->gold;
  if (0x18 < iVar4) {
    iVar1 = sight->round;
    if ((this->prevBomb != -1) &&
       (iVar3 = iVar1 - this->prevBomb,
       0x4444444 < (iVar3 * -0x11111111 + 0x8888888U >> 2 | iVar3 * -0x40000000)))
    goto LAB_0010715b;
    this->prevBomb = iVar1;
    Actions::emplace(actions,BuyItem,0);
    this_00 = Randomizer::getInstance();
    pos = Randomizer::randPosition(this_00);
    Actions::emplace(actions,UseItem,0,pos);
    iVar4 = iVar4 + -0x19;
  }
  if (iVar4 < 5) {
    return;
  }
  iVar1 = sight->round;
LAB_0010715b:
  if ((this->prevWard != -1) &&
     (uVar2 = (iVar1 - this->prevWard) * -0x69d0369d + 0x1b4e81a,
     0x1b4e81a < (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f))) {
    return;
  }
  this->prevWard = iVar1;
  Actions::emplace(actions,BuyItem,1);
  Actions::emplace(actions,UseItem,1,sight->pos);
  return;
}

Assistant:

void BlindItemStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    int gold = sight.gold;
    if (gold >= BombPrice)
    {
        bool flag = false;
        if (prevBomb == -1)
            flag = true;
        else if ((sight.round - prevBomb) % BombCD == 0)
            flag = true;
        if (flag)
        {
            prevBomb = sight.round;
            actions->emplace(BuyItem, BombItem);
            actions->emplace(UseItem, BombItem, Randomizer::getInstance()->randPosition());
            gold -= BombPrice;
        }
    }
    if (gold >= WardPrice)
    {
        bool flag = false;
        if (prevWard == -1)
            flag = true;
        else if ((sight.round - prevWard) % WardCD == 0)
            flag = true;
        if (flag)
        {
            prevWard = sight.round;
            actions->emplace(BuyItem, WardItem);
            actions->emplace(UseItem, WardItem, sight.pos);
        }
    }
}